

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::buildCFGViews(BaseRAPass *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  RABlock **ppRVar4;
  char *pcVar5;
  long *plVar6;
  int __c;
  long in_RDI;
  float __x;
  RABlockVisitItem RVar7;
  RABlock *block;
  iterator __end4;
  iterator __begin4;
  RABlocks *__range4;
  StringTmp<1024UL> sb;
  RABlockVisitItem top;
  Error _err_3;
  RABlock *child;
  uint32_t i;
  RABlock *current;
  Error _err_2;
  ZoneBitVector visited;
  Error _err_1;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> stack;
  Error _err;
  uint32_t count;
  Logger *logger;
  BaseBuilder *in_stack_fffffffffffff938;
  ZoneVector<asmjit::v1_14::RABlock_*> *in_stack_fffffffffffff940;
  BaseRAPass *in_stack_fffffffffffff948;
  ZoneVector<asmjit::v1_14::RABlock_*> *in_stack_fffffffffffff950;
  Logger *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  BaseRAPass *this_00;
  undefined8 in_stack_fffffffffffff968;
  StringTmp<1024UL> *this_01;
  Logger *local_690;
  uint local_678;
  uint local_674 [2];
  undefined8 in_stack_fffffffffffff998;
  ZoneAllocator *in_stack_fffffffffffff9a0;
  long *plVar8;
  ZoneBitVector *in_stack_fffffffffffff9a8;
  StringTmp<1024UL> local_650;
  ZoneVector<asmjit::v1_14::RABlock_*> aZStack_64f [7];
  BaseBuilder *local_648;
  ZoneVector<asmjit::v1_14::RABlock_*> *local_638;
  RABlockVisitItem local_218;
  RABlockVisitItem local_208;
  Error local_1f4;
  RABlock *local_1f0;
  uint local_1e4;
  RABlock *local_1e0;
  Error local_1d4;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  Error local_1bc;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> local_1b8;
  Error local_1a0;
  int local_19c;
  Logger *local_198;
  Error local_184;
  long *local_158;
  long *local_150;
  long local_148;
  RABlock *local_140;
  RABlock *local_138;
  long local_130;
  long local_128;
  RABlock *local_120;
  undefined4 local_114;
  undefined8 *local_108;
  undefined1 local_fd;
  int local_fc;
  long local_f8;
  undefined8 *local_f0;
  long local_e8;
  long local_e0;
  RABlock *local_d8;
  RABlock *local_d0;
  RABlock *local_c8;
  StringTmp<1024UL> *local_c0;
  long local_b0;
  long local_a8;
  uint *local_a0;
  char *local_98;
  String *local_90;
  uint *local_88;
  char *local_80;
  String *local_78;
  undefined8 local_70;
  char *local_68;
  StringTmp<1024UL> *local_60;
  BaseRAPass *local_58;
  Logger *local_50;
  BaseRAPass *local_48;
  undefined4 local_3c;
  RABlock *local_38;
  BaseRAPass *local_30;
  BaseRAPass *local_28;
  BaseRAPass *local_20;
  long *local_18;
  long *local_10;
  StringTmp<1024UL> *local_8;
  
  local_114 = 0x100;
  bVar3 = Support::test<asmjit::v1_14::DiagnosticOptions,asmjit::v1_14::DiagnosticOptions>
                    (*(DiagnosticOptions *)(in_RDI + 0x94),kRADebugCFG);
  if (bVar3) {
    local_690 = *(Logger **)(in_RDI + 0x80);
  }
  else {
    local_690 = (Logger *)0x0;
  }
  local_198 = local_690;
  if (local_690 != (Logger *)0x0) {
    Logger::logf(local_690,__x);
  }
  local_130 = in_RDI + 0xb0;
  local_19c = *(int *)(in_RDI + 0xb8);
  if (local_19c == 0) {
    local_184 = 0;
  }
  else {
    local_1a0 = ZoneVector<asmjit::v1_14::RABlock_*>::reserve
                          ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffff948,
                           (ZoneAllocator *)in_stack_fffffffffffff940,
                           (uint32_t)((ulong)in_stack_fffffffffffff938 >> 0x20));
    local_184 = local_1a0;
    if (local_1a0 == 0) {
      ZoneStack<asmjit::v1_14::RABlockVisitItem>::ZoneStack(&local_1b8);
      local_1bc = ZoneStack<asmjit::v1_14::RABlockVisitItem>::init
                            (&local_1b8,(EVP_PKEY_CTX *)(in_RDI + 0x18));
      lVar2 = stack0xfffffffffffff990;
      local_184 = local_1bc;
      if (local_1bc == 0) {
        local_108 = &local_1d0;
        local_1d0 = 0;
        local_1c8 = 0;
        local_1c4 = 0;
        local_f8 = in_RDI + 0x18;
        local_f0 = &local_1d0;
        local_fc = local_19c;
        local_fd = 0;
        uVar1 = (ulong)stack0xfffffffffffff990 >> 0x38;
        local_1d4 = ZoneBitVector::_resize
                              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                               (uint32_t)((ulong)in_stack_fffffffffffff998 >> 0x20),
                               (uint32_t)in_stack_fffffffffffff998,SUB81(uVar1,0));
        stack0xfffffffffffff990 = lVar2;
        local_184 = local_1d4;
        if (local_1d4 == 0) {
          ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                              ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffff948,
                               (size_t)in_stack_fffffffffffff940);
          local_1e0 = *ppRVar4;
          local_1e4 = 0;
          while( true ) {
            while( true ) {
              local_138 = local_1e0;
              local_120 = local_1e0 + 0x68;
              if (*(uint *)(local_1e0 + 0x70) <= local_1e4) break;
              local_140 = local_1e0;
              local_1e4 = local_1e4 + 1;
              ppRVar4 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                  ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffff948
                                   ,(size_t)in_stack_fffffffffffff940);
              local_1f0 = *ppRVar4;
              local_d0 = local_1f0;
              bVar3 = ZoneBitVector::bitAt
                                ((ZoneBitVector *)in_stack_fffffffffffff948,
                                 (uint32_t)((ulong)in_stack_fffffffffffff940 >> 0x20));
              if (!bVar3) {
                local_d8 = local_1f0;
                ZoneBitVector::setBit
                          ((ZoneBitVector *)in_stack_fffffffffffff948,
                           (uint32_t)((ulong)in_stack_fffffffffffff940 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0));
                RABlockVisitItem::RABlockVisitItem(&local_208,local_1e0,local_1e4);
                RVar7._block._4_4_ = in_stack_fffffffffffff964;
                RVar7._block._0_4_ = in_stack_fffffffffffff960;
                RVar7._8_8_ = in_stack_fffffffffffff968;
                local_1f4 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::append
                                      ((ZoneStack<asmjit::v1_14::RABlockVisitItem> *)
                                       in_stack_fffffffffffff958,RVar7);
                local_184 = local_1f4;
                if (local_1f4 != 0) goto LAB_00155758;
                local_1e0 = local_1f0;
                local_1e4 = 0;
              }
            }
            local_c8 = local_1e0;
            local_38 = local_1e0 + 0xc;
            local_3c = 2;
            *(uint *)local_38 = *(uint *)local_38 | 2;
            local_128 = in_RDI + 0xd0;
            *(undefined4 *)(local_1e0 + 0x2c) = *(undefined4 *)(in_RDI + 0xd8);
            ppRVar4 = &local_1e0;
            ZoneVector<asmjit::v1_14::RABlock_*>::appendUnsafe
                      (in_stack_fffffffffffff940,(RABlock **)in_stack_fffffffffffff938);
            bVar3 = ZoneStackBase::empty((ZoneStackBase *)in_stack_fffffffffffff938);
            if (bVar3) break;
            RVar7 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
                              ((ZoneStack<asmjit::v1_14::RABlockVisitItem> *)
                               in_stack_fffffffffffff950);
            local_218._block = RVar7._block;
            local_218._index = RVar7._index;
            local_1e0 = RABlockVisitItem::block(&local_218);
            pcVar5 = RABlockVisitItem::index(&local_218,(char *)ppRVar4,__c);
            local_1e4 = (uint)pcVar5;
          }
          if (local_198 != (Logger *)0x0) {
            this_01 = &local_650;
            local_c0 = this_01;
            local_8 = this_01;
            memset(this_01,0,0x20);
            StringTmp<1024UL>::_resetToTemporary(this_01);
            this_00 = (BaseRAPass *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960);
            local_158 = (long *)(in_RDI + 0xb0);
            plVar6 = (long *)(*local_158 + (ulong)*(uint *)(in_RDI + 0xb8) * 8);
            local_150 = local_158;
            local_18 = local_158;
            local_10 = local_158;
            for (plVar8 = (long *)*local_158; plVar8 != plVar6; plVar8 = plVar8 + 1) {
              unique0x00012000 = *plVar8;
              String::clear((String *)&local_650);
              local_b0 = stack0xfffffffffffff990;
              local_a8 = stack0xfffffffffffff990 + 0x68;
              if (*(int *)(stack0xfffffffffffff990 + 0x70) == 0) {
                local_e8 = stack0xfffffffffffff990;
                local_678 = *(uint *)(stack0xfffffffffffff990 + 8);
                local_90 = (String *)&local_650;
                local_98 = "  #%u -> {Exit}\n";
                local_a0 = &local_678;
                String::_opFormat(local_90,kAppend,"  #%u -> {Exit}\n",(ulong)local_678);
              }
              else {
                local_e0 = stack0xfffffffffffff990;
                local_674[0] = *(uint *)(stack0xfffffffffffff990 + 8);
                local_78 = (String *)&local_650;
                local_80 = "  #%u -> {";
                local_88 = local_674;
                String::_opFormat(local_78,kAppend,"  #%u -> {",(ulong)local_674[0]);
                local_148 = stack0xfffffffffffff990;
                _dumpBlockIds(this_00,(String *)in_stack_fffffffffffff958,in_stack_fffffffffffff950)
                ;
                local_60 = &local_650;
                local_68 = "}\n";
                local_70 = 0xffffffffffffffff;
                String::_opString((String *)this_01,(ModifyOp)((ulong)this_00 >> 0x20),
                                  (char *)in_stack_fffffffffffff958,
                                  (size_t)in_stack_fffffffffffff950);
              }
              local_50 = local_198;
              in_stack_fffffffffffff948 = (BaseRAPass *)&local_650;
              in_stack_fffffffffffff938 = local_648;
              in_stack_fffffffffffff940 = local_638;
              if ((byte)local_650 < 0x1f) {
                in_stack_fffffffffffff940 = aZStack_64f;
                in_stack_fffffffffffff938 = (BaseBuilder *)(ulong)(byte)local_650;
              }
              in_stack_fffffffffffff950 = in_stack_fffffffffffff940;
              in_stack_fffffffffffff958 = local_198;
              local_58 = in_stack_fffffffffffff948;
              local_48 = in_stack_fffffffffffff948;
              local_30 = in_stack_fffffffffffff948;
              local_28 = in_stack_fffffffffffff948;
              local_20 = in_stack_fffffffffffff948;
              this_00 = in_stack_fffffffffffff948;
              (**(code **)(*(long *)&local_198->_vptr_Logger + 0x10))
                        (local_198,in_stack_fffffffffffff940,in_stack_fffffffffffff938);
            }
            StringTmp<1024UL>::~StringTmp((StringTmp<1024UL> *)in_stack_fffffffffffff938);
          }
          ZoneBitVector::release
                    ((ZoneBitVector *)in_stack_fffffffffffff948,
                     (ZoneAllocator *)in_stack_fffffffffffff940);
          local_184 = 0;
        }
      }
LAB_00155758:
      local_1c0 = 1;
      ZoneStack<asmjit::v1_14::RABlockVisitItem>::~ZoneStack
                ((ZoneStack<asmjit::v1_14::RABlockVisitItem> *)0x155765);
    }
  }
  return local_184;
}

Assistant:

Error BaseRAPass::buildCFGViews() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugCFG);
  ASMJIT_RA_LOG_FORMAT("[BuildCFGViews]\n");
#endif

  uint32_t count = blockCount();
  if (ASMJIT_UNLIKELY(!count)) return kErrorOk;

  ASMJIT_PROPAGATE(_pov.reserve(allocator(), count));

  ZoneStack<RABlockVisitItem> stack;
  ASMJIT_PROPAGATE(stack.init(allocator()));

  ZoneBitVector visited;
  ASMJIT_PROPAGATE(visited.resize(allocator(), count));

  RABlock* current = _blocks[0];
  uint32_t i = 0;

  for (;;) {
    for (;;) {
      if (i >= current->successors().size())
        break;

      // Skip if already visited.
      RABlock* child = current->successors()[i++];
      if (visited.bitAt(child->blockId()))
        continue;

      // Mark as visited to prevent visiting the same block multiple times.
      visited.setBit(child->blockId(), true);

      // Add the current block on the stack, we will get back to it later.
      ASMJIT_PROPAGATE(stack.append(RABlockVisitItem(current, i)));
      current = child;
      i = 0;
    }

    current->makeReachable();
    current->_povOrder = _pov.size();
    _pov.appendUnsafe(current);

    if (stack.empty())
      break;

    RABlockVisitItem top = stack.pop();
    current = top.block();
    i = top.index();
  }

  ASMJIT_RA_LOG_COMPLEX({
    StringTmp<1024> sb;
    for (RABlock* block : blocks()) {
      sb.clear();
      if (block->hasSuccessors()) {
        sb.appendFormat("  #%u -> {", block->blockId());
        _dumpBlockIds(sb, block->successors());
        sb.append("}\n");
      }
      else {
        sb.appendFormat("  #%u -> {Exit}\n", block->blockId());
      }
      logger->log(sb);
    }
  });

  visited.release(allocator());
  return kErrorOk;
}